

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int32 __thiscall mkvmuxer::MkvWriter::Write(MkvWriter *this,void *buffer,uint32 length)

{
  size_t sVar1;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  size_t bytes_written;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_4 = -1;
  }
  else if (in_EDX == 0) {
    local_4 = 0;
  }
  else if (in_RSI == (void *)0x0) {
    local_4 = -1;
  }
  else {
    sVar1 = fwrite(in_RSI,1,(ulong)in_EDX,*(FILE **)(in_RDI + 8));
    local_4 = -1;
    if (sVar1 == in_EDX) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int32 MkvWriter::Write(const void* buffer, uint32 length) {
  if (!file_)
    return -1;

  if (length == 0)
    return 0;

  if (buffer == NULL)
    return -1;

  const size_t bytes_written = fwrite(buffer, 1, length, file_);

  return (bytes_written == length) ? 0 : -1;
}